

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O2

bool __thiscall DOMLSParserHandler::handleError(DOMLSParserHandler *this,DOMError *error)

{
  int iVar1;
  ostream *poVar2;
  wchar16 *pwVar3;
  char *local_28;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Error occurred in DOMBuilder!  Message:  ");
  pwVar3 = (wchar16 *)(**(code **)(*(long *)error + 0x18))(error);
  local_28 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  poVar2 = std::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2," of severity ");
  iVar1 = (**(code **)(*(long *)error + 0x10))(error);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,".");
  std::endl<char,std::char_traits<char>>(poVar2);
  xercesc_4_0::XMLString::release(&local_28,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return true;
}

Assistant:

bool handleError(const DOMError &error)
    {
        char *message = 0;
        std::cerr << "Error occurred in DOMBuilder!  Message:  " <<
            (message = XMLString::transcode(error.getMessage())) << " of severity " << error.getSeverity() << "." << std::endl;
        XMLString::release(&message);
        return true;
    }